

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.hh
# Opt level: O2

void __thiscall
tchecker::graph::directed::
graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
::remove_edges(graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
               *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
                     *n)

{
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
  in_end;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
  it_1;
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>_>
  in_edges;
  edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
  out_end;
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>_>
  out_edges;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  edge_1;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  local_60;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
  local_58;
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>_>
  local_50;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  local_40;
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>_>
  local_38;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  local_28;
  
  edges<tchecker::graph::directed::details::outgoing>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
              *)&local_38,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
              *)this);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t(&local_40,&local_38._end._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
              *)&local_50,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
              *)&local_38);
  while (local_50._begin._edge._t !=
         (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
          )local_40._t) {
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
    ::intrusive_shared_ptr_t
              (&local_60,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
                *)&local_50);
    edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
    ::operator++((edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
                  *)&local_50);
    remove_edge(this,&local_60);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_60);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
              *)&local_50);
  edges<tchecker::graph::directed::details::incoming>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
              *)&local_50,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
              *)this);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t(&local_60,&local_50._end._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            (&local_58._edge,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
              *)&local_50);
  while (local_58._edge._t !=
         (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
          )local_60._t) {
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
    ::intrusive_shared_ptr_t(&local_28,&local_58._edge);
    edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>
    ::operator++(&local_58);
    remove_edge(this,&local_28);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_28);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_58._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_60);
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::~range_t(&local_50);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_40);
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::~range_t(&local_38);
  return;
}

Assistant:

void remove_edges(NODE_PTR const & n)
  {
    auto out_edges = outgoing_edges(n);
    auto out_end = out_edges.end();
    for (auto it = out_edges.begin(); it != out_end;) {
      EDGE_PTR edge = *it;
      ++it;
      remove_edge(edge);
    }

    auto in_edges = incoming_edges(n);
    auto in_end = in_edges.end();
    for (auto it = in_edges.begin(); it != in_end;) {
      EDGE_PTR edge = *it;
      ++it;
      remove_edge(edge);
    }
  }